

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::ClearLog(ExampleAppConsole *this)

{
  char **ptr;
  long lVar1;
  
  if (0 < (this->Items).Size) {
    lVar1 = 0;
    do {
      free((this->Items).Data[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->Items).Size);
  }
  ptr = (this->Items).Data;
  if (ptr != (char **)0x0) {
    (this->Items).Size = 0;
    (this->Items).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->Items).Data = (char **)0x0;
  }
  return;
}

Assistant:

void    ClearLog()
    {
        for (int i = 0; i < Items.Size; i++)
            free(Items[i]);
        Items.clear();
    }